

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O0

void __thiscall VideoNode::doUi(VideoNode *this)

{
  pointer filename_00;
  bool bVar1;
  uint uVar2;
  pointer pVVar3;
  uchar *data;
  bool local_52;
  undefined1 local_40 [4];
  int result;
  Image screen;
  char *filename;
  VideoNode *local_10;
  VideoNode *this_local;
  
  local_10 = this;
  bVar1 = ImGui::Combo("Resolution",&this->mode_index,c_mode_names,4,-1);
  if ((bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->engine), bVar1)) {
    pVVar3 = std::unique_ptr<VideoEngine,_std::default_delete<VideoEngine>_>::operator->
                       (&this->engine);
    VideoEngine::setCanvasResolution
              (pVVar3,c_mode_res[this->mode_index].w,c_mode_res[this->mode_index].h);
  }
  ImVec2::ImVec2((ImVec2 *)&filename,0.0,0.0);
  bVar1 = ImGui::Button("Make screensot",(ImVec2 *)&filename);
  local_52 = false;
  if (bVar1) {
    local_52 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->engine);
  }
  if (local_52 != false) {
    screen.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "screenshot.jpg";
    pVVar3 = std::unique_ptr<VideoEngine,_std::default_delete<VideoEngine>_>::operator->
                       (&this->engine);
    VideoEngine::makeScreenshot((Image *)local_40,pVVar3);
    filename_00 = screen.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&screen);
    uVar2 = stbi_write_jpg((char *)filename_00,(int)local_40,result,3,data,0x50);
    aAppDebugPrintf("screenshot written to file %s, result: %d",
                    screen.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
    Image::~Image((Image *)local_40);
  }
  return;
}

Assistant:

void VideoNode::doUi() noexcept {
	if (ImGui::Combo("Resolution", &mode_index, c_mode_names, COUNTOF(c_mode_names))) {
		if (engine)
			engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (ImGui::Button("Make screensot") && engine) {
		// TODO filename picker
		// TODO incrementable filenames
		// TODO project-relative

		const char *filename = "screenshot.jpg";
		const Image screen = engine->makeScreenshot();
		const int result = stbi_write_jpg(filename, screen.w, screen.h, 3, screen.data.data(), 80);
		MSG("screenshot written to file %s, result: %d", filename, result);
	}
}